

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::iterator
          (iterator *this,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *tree)

{
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *tree_local;
  iterator *this_local;
  
  this->db_ = tree;
  std::
  stack<unodb::detail::iter_result<unodb::detail::node_header>,std::deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>>
  ::
  stack<std::deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>,void>
            ((stack<unodb::detail::iter_result<unodb::detail::node_header>,std::deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>>
              *)&this->stack_);
  memset(&this->keybuf_,0,0x118);
  detail::key_buffer::key_buffer(&this->keybuf_);
  return;
}

Assistant:

explicit iterator(db& tree) noexcept : db_(tree) {}